

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O2

ABC_Manager ABC_InitManager(void)

{
  ABC_Manager pAVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  stmm_table *psVar4;
  Mem_Flex_t *pMVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  
  Abc_Start();
  pAVar1 = (ABC_Manager)calloc(1,0xb0);
  pAVar2 = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pAVar1->pNtk = pAVar2;
  pcVar3 = Extra_UtilStrsav("csat_network");
  pAVar2->pName = pcVar3;
  psVar4 = stmm_init_table(strcmp,stmm_strhash);
  pAVar1->tName2Node = psVar4;
  psVar4 = stmm_init_table(stmm_ptrcmp,stmm_ptrhash);
  pAVar1->tNode2Name = psVar4;
  pMVar5 = Mem_FlexStart();
  pAVar1->pMmNames = pMVar5;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  pAVar1->vNodes = pVVar6;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(400);
  pVVar8->pArray = piVar9;
  pAVar1->vValues = pVVar8;
  Prove_ParamsSetDefault(&pAVar1->Params);
  return pAVar1;
}

Assistant:

ABC_Manager ABC_InitManager()
{
    ABC_Manager_t * mng;
    Abc_Start();
    mng = ABC_ALLOC( ABC_Manager_t, 1 );
    memset( mng, 0, sizeof(ABC_Manager_t) );
    mng->pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    mng->pNtk->pName = Extra_UtilStrsav("csat_network");
    mng->tName2Node = stmm_init_table(strcmp, stmm_strhash);
    mng->tNode2Name = stmm_init_table(stmm_ptrcmp, stmm_ptrhash);
    mng->pMmNames   = Mem_FlexStart();
    mng->vNodes     = Vec_PtrAlloc( 100 );
    mng->vValues    = Vec_IntAlloc( 100 );
    mng->mode       = 0; // set "resource-aware integration" as the default mode
    // set default parameters for CEC
    Prove_ParamsSetDefault( &mng->Params );
    // set infinite resource limit for the final mitering
//    mng->Params.nMiteringLimitLast = ABC_INFINITY;
    return mng;
}